

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# i2cdev.cpp
# Opt level: O0

bool __thiscall
I2Cdev::writeBits(I2Cdev *this,uint8_t regAddr,uint8_t bitStart,uint8_t length,uint8_t data)

{
  byte bVar1;
  int iVar2;
  byte local_1d;
  byte local_1c;
  byte local_1b;
  uint8_t local_1a;
  byte local_19;
  uint8_t mask;
  uint8_t b;
  uint8_t data_local;
  uint8_t length_local;
  uint8_t bitStart_local;
  I2Cdev *pIStack_18;
  uint8_t regAddr_local;
  I2Cdev *this_local;
  
  local_1c = data;
  local_1b = length;
  local_1a = bitStart;
  local_19 = regAddr;
  pIStack_18 = this;
  iVar2 = (*(this->super_I2Cgeneric)._vptr_I2Cgeneric[8])(this,(ulong)regAddr,&local_1d,0);
  if ((char)iVar2 == '\0') {
    this_local._7_1_ = false;
  }
  else {
    bVar1 = (byte)((1 << (local_1b & 0x1f)) + -1 << ((local_1a - local_1b) + 1 & 0x1f));
    local_1c = local_1c << ((local_1a - local_1b) + 1 & 0x1f) & bVar1;
    local_1d = local_1d & (bVar1 ^ 0xff) | local_1c;
    iVar2 = (*(this->super_I2Cgeneric)._vptr_I2Cgeneric[0x18])(this,(ulong)local_19,(ulong)local_1d)
    ;
    this_local._7_1_ = (bool)((byte)iVar2 & 1);
  }
  return this_local._7_1_;
}

Assistant:

bool I2Cdev::writeBits(uint8_t regAddr, uint8_t bitStart, uint8_t length, uint8_t data) {
    //      010 value to write
    // 76543210 bit numbers
    //    xxx   args: bitStart=4, length=3
    // 00011100 mask byte
    // 10101111 original value (sample)
    // 10100011 original & ~mask
    // 10101011 masked | value
    uint8_t b;
    if (this->readByte(regAddr, &b) != 0) {
        uint8_t mask = ((1 << length) - 1) << (bitStart - length + 1);
        data <<= (bitStart - length + 1); // shift data into correct position
        data &= mask; // zero all non-important bits in data
        b &= ~(mask); // zero all important bits in existing byte
        b |= data; // combine data with existing byte
        return this->writeByte(regAddr, b);
    } else {
        return false;
    }
}